

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_8x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  int y_mask;
  uint uVar14;
  short sVar15;
  short sVar17;
  undefined1 auVar16 [16];
  ushort uVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ushort uVar29;
  ushort uVar33;
  ushort uVar35;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  undefined1 auVar31 [16];
  ushort uVar30;
  ushort uVar34;
  ushort uVar36;
  ushort uVar38;
  ushort uVar40;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar32 [16];
  ushort uVar47;
  undefined1 auVar48 [16];
  
  auVar28 = _DAT_0046ffb0;
  auVar16 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  sVar15 = auVar16._0_2_;
  sVar17 = auVar16._2_2_;
  auVar32._2_2_ = sVar17 * 0x10;
  auVar32._0_2_ = sVar15;
  auVar32._4_2_ = sVar15 * 0x1f;
  auVar32._6_2_ = sVar17 * 0x2e;
  auVar32._8_2_ = sVar15 * 0x3c;
  auVar32._10_2_ = sVar17 * 0x4a;
  auVar32._12_2_ = sVar15 * 0x57;
  auVar32._14_2_ = sVar17 * 99;
  auVar16._0_2_ = sVar15 * 0xbe;
  auVar16._2_2_ = sVar17 * 0xc5;
  auVar16._4_2_ = sVar15 * 0xcc;
  auVar16._6_2_ = sVar17 * 0xd3;
  auVar16._8_2_ = sVar15 * 0xd9;
  auVar16._10_2_ = sVar17 * 0xde;
  auVar16._12_2_ = sVar15 * 0xe3;
  auVar16._14_2_ = sVar17 * 0xe7;
  uVar1 = *(ulong *)top_row;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = (char)(uVar1 >> 8);
  uVar18 = (ushort)(byte)uVar1;
  uVar14 = 0x1000100;
  while( true ) {
    auVar31 = _DAT_0046ffd0;
    sVar19 = auVar11._0_2_;
    sVar20 = auVar10._0_2_;
    sVar21 = (short)Var9;
    sVar22 = auVar7._8_2_;
    sVar23 = auVar5._10_2_;
    sVar24 = auVar3._12_2_;
    uVar30 = auVar2._13_2_ >> 8;
    if (0xf0e0f0e < uVar14) break;
    auVar26._4_4_ = uVar14;
    auVar26._0_4_ = uVar14;
    auVar26._8_4_ = uVar14;
    auVar26._12_4_ = uVar14;
    auVar31 = pshufb(auVar28,auVar26);
    auVar48 = pshufb(auVar32,auVar26);
    uVar29 = auVar31._0_2_ * uVar18 + auVar48._0_2_ + 0x80;
    uVar33 = auVar31._2_2_ * sVar19 + auVar48._2_2_ + 0x80;
    uVar35 = auVar31._4_2_ * sVar20 + auVar48._4_2_ + 0x80;
    uVar37 = auVar31._6_2_ * sVar21 + auVar48._6_2_ + 0x80;
    uVar39 = auVar31._8_2_ * sVar22 + auVar48._8_2_ + 0x80;
    uVar41 = auVar31._10_2_ * sVar23 + auVar48._10_2_ + 0x80;
    uVar43 = auVar31._12_2_ * sVar24 + auVar48._12_2_ + 0x80;
    uVar45 = auVar31._14_2_ * uVar30 + auVar48._14_2_ + 0x80;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar36 = uVar35 >> 8;
    uVar38 = uVar37 >> 8;
    uVar40 = uVar39 >> 8;
    uVar42 = uVar41 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                           CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                    (0xff < uVar42),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT11((uVar34 != 0) *
                                                                         (uVar34 < 0x100) *
                                                                         (char)(uVar33 >> 8) -
                                                                         (0xff < uVar34),
                                                                         (uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30))))))));
    dst = dst + stride;
    uVar14 = uVar14 + 0x2020202;
  }
  auVar28._0_2_ = sVar15 * 0x6f;
  auVar28._2_2_ = sVar17 * 0x7b;
  auVar28._4_2_ = sVar15 * 0x86;
  auVar28._6_2_ = sVar17 * 0x91;
  auVar28._8_2_ = sVar15 * 0x9b;
  auVar28._10_2_ = sVar17 * 0xa4;
  auVar28._12_2_ = sVar15 * 0xad;
  auVar28._14_2_ = sVar17 * 0xb6;
  for (uVar14 = 0x1000100; auVar32 = _DAT_0046fff0, uVar14 < 0xf0e0f0f; uVar14 = uVar14 + 0x2020202)
  {
    auVar27._4_4_ = uVar14;
    auVar27._0_4_ = uVar14;
    auVar27._8_4_ = uVar14;
    auVar27._12_4_ = uVar14;
    auVar32 = pshufb(auVar31,auVar27);
    auVar48 = pshufb(auVar28,auVar27);
    uVar29 = auVar32._0_2_ * uVar18 + auVar48._0_2_ + 0x80;
    uVar34 = auVar32._2_2_ * sVar19 + auVar48._2_2_ + 0x80;
    uVar36 = auVar32._4_2_ * sVar20 + auVar48._4_2_ + 0x80;
    uVar38 = auVar32._6_2_ * sVar21 + auVar48._6_2_ + 0x80;
    uVar40 = auVar32._8_2_ * sVar22 + auVar48._8_2_ + 0x80;
    uVar42 = auVar32._10_2_ * sVar23 + auVar48._10_2_ + 0x80;
    uVar44 = auVar32._12_2_ * sVar24 + auVar48._12_2_ + 0x80;
    uVar46 = auVar32._14_2_ * uVar30 + auVar48._14_2_ + 0x80;
    uVar33 = uVar29 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar33))))))));
    dst = dst + stride;
  }
  for (uVar14 = 0x1000100; auVar28 = _DAT_00470010, uVar14 < 0xf0e0f0f; uVar14 = uVar14 + 0x2020202)
  {
    auVar25._4_4_ = uVar14;
    auVar25._0_4_ = uVar14;
    auVar25._8_4_ = uVar14;
    auVar25._12_4_ = uVar14;
    auVar28 = pshufb(auVar32,auVar25);
    auVar31 = pshufb(auVar16,auVar25);
    uVar29 = auVar28._0_2_ * uVar18 + auVar31._0_2_ + 0x80;
    uVar34 = auVar28._2_2_ * sVar19 + auVar31._2_2_ + 0x80;
    uVar36 = auVar28._4_2_ * sVar20 + auVar31._4_2_ + 0x80;
    uVar38 = auVar28._6_2_ * sVar21 + auVar31._6_2_ + 0x80;
    uVar40 = auVar28._8_2_ * sVar22 + auVar31._8_2_ + 0x80;
    uVar42 = auVar28._10_2_ * sVar23 + auVar31._10_2_ + 0x80;
    uVar44 = auVar28._12_2_ * sVar24 + auVar31._12_2_ + 0x80;
    uVar46 = auVar28._14_2_ * uVar30 + auVar31._14_2_ + 0x80;
    uVar33 = uVar29 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar33))))))));
    dst = dst + stride;
  }
  auVar31._0_2_ = sVar15 * 0xeb;
  auVar31._2_2_ = sVar17 * 0xef;
  auVar31._4_2_ = sVar15 * 0xf2;
  auVar31._6_2_ = sVar17 * 0xf4;
  auVar31._8_2_ = sVar15 * 0xf6;
  auVar31._10_2_ = sVar17 * 0xf7;
  auVar31._12_2_ = sVar15 * 0xf8;
  auVar31._14_2_ = sVar17 * 0xf8;
  for (uVar14 = 0x1000100; uVar14 < 0xf0e0f0f; uVar14 = uVar14 + 0x2020202) {
    auVar48._4_4_ = uVar14;
    auVar48._0_4_ = uVar14;
    auVar48._8_4_ = uVar14;
    auVar48._12_4_ = uVar14;
    auVar16 = pshufb(auVar28,auVar48);
    auVar32 = pshufb(auVar31,auVar48);
    uVar29 = auVar16._0_2_ * uVar18 + auVar32._0_2_ + 0x80;
    uVar34 = auVar16._2_2_ * sVar19 + auVar32._2_2_ + 0x80;
    uVar36 = auVar16._4_2_ * sVar20 + auVar32._4_2_ + 0x80;
    uVar38 = auVar16._6_2_ * sVar21 + auVar32._6_2_ + 0x80;
    uVar40 = auVar16._8_2_ * sVar22 + auVar32._8_2_ + 0x80;
    uVar42 = auVar16._10_2_ * sVar23 + auVar32._10_2_ + 0x80;
    uVar44 = auVar16._12_2_ * sVar24 + auVar32._12_2_ + 0x80;
    uVar46 = auVar16._14_2_ * uVar30 + auVar32._14_2_ + 0x80;
    uVar33 = uVar29 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                    (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8)
                                             - (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                      (char)(uVar38 >> 8) - (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               (char)(uVar36 >> 8) - (0xff < uVar37)
                                                               ,CONCAT11((uVar35 != 0) *
                                                                         (uVar35 < 0x100) *
                                                                         (char)(uVar34 >> 8) -
                                                                         (0xff < uVar35),
                                                                         (uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar33))))))));
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_8x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}